

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void glcts::getExpectedStencilComponentsForTextureLod
               (GLuint pixel_index,GLint cube_face,GLint element_index,GLint n_layers,
               GLint n_mipmap_levels,GLuint *out_components)

{
  *out_components =
       (int)((cube_face + element_index + (n_mipmap_levels - 1U & -(pixel_index & 1))) * 0xff +
            0x2fd) / (n_layers + n_mipmap_levels + 6) & 0xff;
  return;
}

Assistant:

void getExpectedStencilComponentsForTextureLod(glw::GLuint pixel_index, glw::GLint cube_face, glw::GLint element_index,
											   glw::GLint n_layers, glw::GLint n_mipmap_levels,
											   glw::GLuint* out_components)
{
	glw::GLubyte value		  = 0;
	glw::GLint   mipmap_level = 0;

	if (1 == pixel_index % 2)
	{
		mipmap_level = n_mipmap_levels - 1;
	}

	getStencilComponent(cube_face, element_index, mipmap_level, n_layers, n_mipmap_levels, value);

	out_components[0] = value;
}